

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  global_State *g;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  GCRef *p [2];
  GCfunc *fn [2];
  uint *local_48 [2];
  ulong local_38 [3];
  
  lVar6 = 0;
  lVar5 = 0;
  while( true ) {
    pTVar1 = L->base;
    iVar4 = (int)lVar5;
    if ((L->top <= (TValue *)((long)pTVar1 + lVar6)) ||
       (*(int *)((long)pTVar1 + lVar5 * 8 + 4) != -9)) {
      lj_err_argt(L,iVar4 + 1,6);
    }
    uVar3 = (ulong)pTVar1[lVar5].u32.lo;
    *(ulong *)((long)local_38 + lVar5 * 4) = uVar3;
    if (*(char *)(uVar3 + 6) != '\0') {
      lj_err_arg(L,iVar4 + 1,LJ_ERR_NOLFUNC);
    }
    iVar2 = lj_lib_checkint(L,iVar4 + 2);
    if ((uint)*(byte *)(uVar3 + 7) <= iVar2 - 1U) break;
    *(ulong *)((long)local_48 + lVar5 * 4) = uVar3 + (ulong)(iVar2 - 1U) * 4 + 0x14;
    lVar5 = lVar5 + 2;
    lVar6 = lVar6 + 0x10;
    if (lVar5 != 2) {
      *local_48[0] = *local_48[1];
      if (((((GCobj *)(ulong)*local_48[1])->gch).marked & 3) != 0) {
        if ((*(byte *)(local_38[0] + 4) & 4) != 0) {
          g = (global_State *)(ulong)(L->glref).ptr32;
          if ((byte)((g->gc).state - 1) < 2) {
            gc_mark(g,(GCobj *)(ulong)*local_48[1]);
          }
          else {
            *(byte *)(local_38[0] + 4) =
                 (g->gc).currentwhite & 3 | *(byte *)(local_38[0] + 4) & 0xf8;
          }
        }
      }
      return 0;
    }
  }
  lj_err_arg(L,iVar4 + 2,LJ_ERR_IDXRNG);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}